

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndGroup(void)

{
  ImGuiItemStatusFlags *pIVar1;
  ImVec2 IVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiGroupData *pIVar5;
  bool bVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  char cVar9;
  long lVar10;
  ImGuiID IVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ImRect local_30;
  ImVec2 local_20;
  
  pIVar7 = GImGui;
  lVar10 = (long)(GImGui->GroupStack).Size;
  if (lVar10 < 1) {
    __assert_fail("g.GroupStack.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1e48,"void ImGui::EndGroup()");
  }
  pIVar4 = GImGui->CurrentWindow;
  pIVar5 = (GImGui->GroupStack).Data;
  if (pIVar5[lVar10 + -1].WindowID != pIVar4->ID) {
    __assert_fail("group_data.WindowID == window->ID",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1e4b,"void ImGui::EndGroup()");
  }
  local_30.Min = pIVar5[lVar10 + -1].BackupCursorPos;
  IVar2 = (pIVar4->DC).CursorMaxPos;
  fVar17 = pIVar5[lVar10 + -1].BackupCursorPos.x;
  fVar18 = pIVar5[lVar10 + -1].BackupCursorPos.y;
  fVar15 = IVar2.x;
  fVar16 = IVar2.y;
  uVar13 = -(uint)(fVar17 <= fVar15);
  uVar14 = -(uint)(fVar18 <= fVar16);
  local_30.Max = (ImVec2)(CONCAT44(~uVar14 & (uint)fVar18,~uVar13 & (uint)fVar17) |
                         CONCAT44((uint)fVar16 & uVar14,(uint)fVar15 & uVar13));
  (pIVar4->DC).CursorPos = local_30.Min;
  fVar17 = pIVar5[lVar10 + -1].BackupCursorMaxPos.x;
  fVar18 = pIVar5[lVar10 + -1].BackupCursorMaxPos.y;
  uVar13 = -(uint)(fVar15 <= fVar17);
  uVar14 = -(uint)(fVar16 <= fVar18);
  (pIVar4->DC).CursorMaxPos =
       (ImVec2)(CONCAT44(~uVar14 & (uint)fVar16,~uVar13 & (uint)fVar15) |
               CONCAT44((uint)fVar18 & uVar14,(uint)fVar17 & uVar13));
  (pIVar4->DC).Indent.x = pIVar5[lVar10 + -1].BackupIndent.x;
  (pIVar4->DC).GroupOffset.x = pIVar5[lVar10 + -1].BackupGroupOffset.x;
  (pIVar4->DC).CurrLineSize = pIVar5[lVar10 + -1].BackupCurrLineSize;
  fVar15 = pIVar5[lVar10 + -1].BackupCurrLineTextBaseOffset;
  (pIVar4->DC).CurrLineTextBaseOffset = fVar15;
  if (pIVar7->LogEnabled == true) {
    pIVar7->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar5[lVar10 + -1].EmitItem == false) goto LAB_0014e134;
  fVar16 = (pIVar4->DC).PrevLineTextBaseOffset;
  uVar13 = -(uint)(fVar15 <= fVar16);
  (pIVar4->DC).CurrLineTextBaseOffset = (float)(~uVar13 & (uint)fVar15 | (uint)fVar16 & uVar13);
  local_20.x = local_30.Max.x - local_30.Min.x;
  local_20.y = local_30.Max.y - local_30.Min.y;
  ItemSize(&local_20,-1.0);
  ItemAdd(&local_30,0,(ImRect *)0x0,0);
  IVar11 = pIVar7->ActiveId;
  if (pIVar5[lVar10 + -1].BackupActiveIdIsAlive == IVar11) {
    if (pIVar5[lVar10 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar9 = pIVar7->ActiveIdPreviousFrameIsAlive;
joined_r0x0014e0c5:
      if (cVar9 != '\0') {
        IVar11 = pIVar7->ActiveIdPreviousFrame;
        cVar9 = '\x01';
        bVar8 = false;
        goto LAB_0014e0b8;
      }
    }
    bVar6 = false;
    cVar9 = '\0';
  }
  else {
    bVar12 = pIVar7->ActiveIdIsAlive != IVar11;
    if (pIVar5[lVar10 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar9 = pIVar7->ActiveIdPreviousFrameIsAlive;
      bVar8 = true;
      if (IVar11 == 0 || bVar12) goto joined_r0x0014e0c5;
    }
    else {
      cVar9 = '\0';
      bVar6 = false;
      bVar8 = true;
      if (IVar11 == 0 || bVar12) goto LAB_0014e0cb;
    }
LAB_0014e0b8:
    bVar6 = bVar8;
    (pIVar4->DC).LastItemId = IVar11;
  }
LAB_0014e0cb:
  (pIVar4->DC).LastItemRect.Min = local_30.Min;
  (pIVar4->DC).LastItemRect.Max = local_30.Max;
  if ((pIVar5[lVar10 + -1].BackupHoveredIdIsAlive == false) && (pIVar7->HoveredId != 0)) {
    pIVar1 = &(pIVar4->DC).LastItemStatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((bVar6) && (pIVar7->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar4->DC).LastItemStatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar13 = (pIVar4->DC).LastItemStatusFlags;
  (pIVar4->DC).LastItemStatusFlags = uVar13 | 0x20;
  if ((cVar9 != '\0') && (pIVar7->ActiveId != pIVar7->ActiveIdPreviousFrame)) {
    (pIVar4->DC).LastItemStatusFlags = uVar13 | 0x60;
  }
LAB_0014e134:
  iVar3 = (pIVar7->GroupStack).Size;
  if (iVar3 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                  ,0x6a1,"void ImVector<ImGuiGroupData>::pop_back() [T = ImGuiGroupData]");
  }
  (pIVar7->GroupStack).Size = iVar3 + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        window->DC.LastItemId = g.ActiveId;
    else if (group_contains_prev_active_id)
        window->DC.LastItemId = g.ActiveIdPreviousFrame;
    window->DC.LastItemRect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}